

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O3

void Mvc_CoverAddDupCubeTail(Mvc_Cover_t *pCover,Mvc_Cube_t *pCube)

{
  int *piVar1;
  Mvc_Cube_t *pMVar2;
  ulong uVar3;
  Mvc_Cube_t *pMVar4;
  uint uVar5;
  bool bVar6;
  
  pMVar2 = Mvc_CubeAlloc(pCover);
  uVar5 = *(uint *)&pMVar2->field_0x8 & 0xffffff;
  if (uVar5 == 0) {
    pMVar2->pData[0] = pCube->pData[0];
  }
  else if (uVar5 == 1) {
    pMVar2->pData[0] = pCube->pData[0];
    *(undefined4 *)&pMVar2->field_0x14 = *(undefined4 *)&pCube->field_0x14;
  }
  else {
    uVar3 = (ulong)(*(uint *)&pMVar2->field_0x8 & 0xffffff);
    do {
      pMVar2->pData[uVar3] = pCube->pData[uVar3];
      bVar6 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar6);
  }
  if ((pCover->lCubes).pHead == (Mvc_Cube_t *)0x0) {
    pMVar4 = (Mvc_Cube_t *)&pCover->lCubes;
  }
  else {
    pMVar4 = (pCover->lCubes).pTail;
  }
  pMVar4->pNext = pMVar2;
  (pCover->lCubes).pTail = pMVar2;
  pMVar2->pNext = (Mvc_Cube_t *)0x0;
  piVar1 = &(pCover->lCubes).nItems;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void Mvc_CoverAddDupCubeTail( Mvc_Cover_t * pCover, Mvc_Cube_t * pCube )
{
    Mvc_Cube_t * pCubeNew;
    // copy the cube as part of this cover
    pCubeNew = Mvc_CubeAlloc( pCover );
    Mvc_CubeBitCopy( pCubeNew, pCube );
    // clean the last bits of the new cube
//    pCubeNew->pData[pCubeNew->iLast] &= (BITS_FULL >> pCubeNew->nUnused);
    // add the cube at the end
    Mvc_CoverAddCubeTail( pCover, pCubeNew );
}